

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

void stbiw__encode_png_line
               (uchar *pixels,int stride_bytes,int width,int height,int y,int n,int filter_type,
               char *line_buffer)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uchar *puVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  byte bVar8;
  byte *__src;
  long lVar9;
  int iVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  
  piVar7 = stbiw__encode_png_line::mapping;
  if (y == 0) {
    piVar7 = stbiw__encode_png_line::firstmap;
  }
  iVar12 = piVar7[filter_type];
  iVar10 = -stride_bytes;
  iVar3 = ~y + height;
  if (stbi__flip_vertically_on_write == 0) {
    iVar10 = stride_bytes;
    iVar3 = y;
  }
  lVar5 = (long)(iVar3 * stride_bytes);
  __src = pixels + lVar5;
  if (iVar12 == 0) {
    memcpy(line_buffer,__src,(long)(n * width));
    return;
  }
  if (0 < n) {
    uVar15 = 0;
    do {
      switch(iVar12) {
      case 1:
      case 5:
      case 6:
        bVar8 = __src[uVar15];
        break;
      case 2:
      case 4:
        bVar8 = __src[uVar15] - pixels[uVar15 + (lVar5 - iVar10)];
        break;
      case 3:
        bVar8 = __src[uVar15] - (pixels[uVar15 + (lVar5 - iVar10)] >> 1);
        break;
      default:
        goto switchD_001b31eb_default;
      }
      line_buffer[uVar15] = bVar8;
switchD_001b31eb_default:
      uVar15 = uVar15 + 1;
    } while ((uint)n != uVar15);
  }
  switch(iVar12) {
  case 1:
    if (n < width * n) {
      lVar5 = (long)n;
      lVar6 = (long)(width * n);
      do {
        line_buffer[lVar5] = __src[lVar5] - *__src;
        __src = __src + 1;
        line_buffer = line_buffer + 1;
        lVar6 = lVar6 + -1;
      } while (lVar5 != lVar6);
    }
    break;
  case 2:
    if (n < width * n) {
      lVar6 = (long)n;
      do {
        line_buffer[lVar6] = __src[lVar6] - pixels[lVar6 + (lVar5 - iVar10)];
        lVar6 = lVar6 + 1;
      } while (width * n != lVar6);
    }
    break;
  case 3:
    if (n < width * n) {
      lVar6 = (long)n;
      puVar4 = pixels + lVar5 + lVar6;
      lVar5 = 0;
      do {
        line_buffer[lVar5 + lVar6] =
             *puVar4 - (char)((uint)puVar4[-(long)iVar10] + (uint)__src[lVar5] >> 1);
        puVar4 = puVar4 + 1;
        lVar5 = lVar5 + 1;
      } while (width * n - lVar6 != lVar5);
    }
    break;
  case 4:
    if (n < width * n) {
      lVar6 = (long)n;
      lVar9 = 0;
      do {
        bVar8 = __src[lVar9];
        bVar1 = pixels[lVar9 + ((lVar6 + lVar5) - (long)iVar10)];
        bVar11 = pixels[lVar9 + (lVar5 - iVar10)];
        iVar12 = ((uint)bVar1 + (uint)bVar8) - (uint)bVar11;
        uVar14 = iVar12 - (uint)bVar8;
        uVar2 = -uVar14;
        if (0 < (int)uVar14) {
          uVar2 = uVar14;
        }
        uVar16 = iVar12 - (uint)bVar1;
        uVar14 = -uVar16;
        if (0 < (int)uVar16) {
          uVar14 = uVar16;
        }
        uVar13 = iVar12 - (uint)bVar11;
        uVar16 = -uVar13;
        if (0 < (int)uVar13) {
          uVar16 = uVar13;
        }
        if (uVar14 <= uVar16) {
          bVar11 = bVar1;
        }
        if (uVar16 < uVar2) {
          bVar8 = bVar11;
        }
        if (uVar14 < uVar2) {
          bVar8 = bVar11;
        }
        line_buffer[lVar9 + lVar6] = pixels[lVar9 + lVar6 + lVar5] - bVar8;
        lVar9 = lVar9 + 1;
      } while (width * n - lVar6 != lVar9);
    }
    break;
  case 5:
    if (n < width * n) {
      lVar5 = (long)n;
      lVar6 = (long)(width * n);
      do {
        line_buffer[lVar5] = __src[lVar5] - (*__src >> 1);
        __src = __src + 1;
        line_buffer = line_buffer + 1;
        lVar6 = lVar6 + -1;
      } while (lVar5 != lVar6);
    }
    break;
  case 6:
    if (n < width * n) {
      lVar5 = (long)n;
      lVar6 = (long)(width * n);
      do {
        line_buffer[lVar5] = __src[lVar5] - *__src;
        __src = __src + 1;
        line_buffer = line_buffer + 1;
        lVar6 = lVar6 + -1;
      } while (lVar5 != lVar6);
    }
  }
  return;
}

Assistant:

static void stbiw__encode_png_line(unsigned char *pixels, int stride_bytes, int width, int height, int y, int n, int filter_type, signed char *line_buffer)
{
   static int mapping[] = { 0,1,2,3,4 };
   static int firstmap[] = { 0,1,0,5,6 };
   int *mymap = (y != 0) ? mapping : firstmap;
   int i;
   int type = mymap[filter_type];
   unsigned char *z = pixels + stride_bytes * (stbi__flip_vertically_on_write ? height-1-y : y);
   int signed_stride = stbi__flip_vertically_on_write ? -stride_bytes : stride_bytes;

   if (type==0) {
      memcpy(line_buffer, z, width*n);
      return;
   }

   // first loop isn't optimized since it's just one pixel
   for (i = 0; i < n; ++i) {
      switch (type) {
         case 1: line_buffer[i] = z[i]; break;
         case 2: line_buffer[i] = z[i] - z[i-signed_stride]; break;
         case 3: line_buffer[i] = z[i] - (z[i-signed_stride]>>1); break;
         case 4: line_buffer[i] = (signed char) (z[i] - stbiw__paeth(0,z[i-signed_stride],0)); break;
         case 5: line_buffer[i] = z[i]; break;
         case 6: line_buffer[i] = z[i]; break;
      }
   }
   switch (type) {
      case 1: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - z[i-n]; break;
      case 2: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - z[i-signed_stride]; break;
      case 3: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - ((z[i-n] + z[i-signed_stride])>>1); break;
      case 4: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - stbiw__paeth(z[i-n], z[i-signed_stride], z[i-signed_stride-n]); break;
      case 5: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - (z[i-n]>>1); break;
      case 6: for (i=n; i < width*n; ++i) line_buffer[i] = z[i] - stbiw__paeth(z[i-n], 0,0); break;
   }
}